

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDiffReporter.cpp
# Opt level: O3

void __thiscall
ApprovalTests::GenericDiffReporter::GenericDiffReporter(GenericDiffReporter *this,string *program)

{
  pointer pcVar1;
  string local_48;
  
  (this->super_CommandReporter).super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__GenericDiffReporter_0016af00;
  pcVar1 = (program->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + program->_M_string_length);
  CommandReporter::CommandReporter
            (&this->super_CommandReporter,&local_48,&(this->launcher).super_CommandLauncher);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->super_CommandReporter).super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__GenericDiffReporter_0016af00;
  SystemLauncher::SystemLauncher(&this->launcher,false,false);
  return;
}

Assistant:

GenericDiffReporter::GenericDiffReporter(const std::string& program)
        : CommandReporter(program, &launcher)
    {
    }